

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

iterator * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
          (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this)

{
  InnerMap *in_RDI;
  InnerMap *this_00;
  InnerIt local_20;
  
  this_00 = in_RDI;
  InnerMap::begin(in_RDI);
  iterator::iterator((iterator *)this_00,&local_20);
  return (iterator *)in_RDI;
}

Assistant:

iterator begin() { return iterator(elements_->begin()); }